

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dithering.cpp
# Opt level: O1

Methods __thiscall ON_Dithering::Method(ON_Dithering *this)

{
  ON_InternalXMLImpl *this_00;
  bool bVar1;
  ON_wString s;
  undefined1 auStack_208 [256];
  ON_XMLVariant local_108;
  
  this_00 = &this->m_impl->super_ON_InternalXMLImpl;
  ::ON_XMLVariant::ON_XMLVariant(&local_108,L"");
  ON_InternalXMLImpl::GetParameter
            ((ON_XMLVariant *)(auStack_208 + 8),this_00,
             L"render-content-manager-document/settings/rendering",L"dithering",&local_108);
  ::ON_XMLVariant::AsString((ON_XMLVariant *)auStack_208);
  ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)(auStack_208 + 8));
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  bVar1 = ::operator==(L"floyd-steinberg",(ON_wString *)auStack_208);
  ON_wString::~ON_wString((ON_wString *)auStack_208);
  return (uint)bVar1;
}

Assistant:

ON_Dithering::Methods ON_Dithering::Method(void) const
{
  const ON_wString s = m_impl->GetParameter(XMLPathDit(), ON_RDK_DITHERING_METHOD, L"").AsString();
  if (ON_RDK_DITHERING_METHOD_FLOYD_STEINBERG == s)
    return Methods::FloydSteinberg;

  return Methods::SimpleNoise;
}